

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void AddToBBox(float *child,float *parent)

{
  float fVar1;
  
  fVar1 = *child;
  if (*parent <= fVar1 && fVar1 != *parent) {
    *parent = fVar1;
  }
  if (child[1] < parent[1]) {
    parent[1] = child[1];
  }
  if (child[2] < parent[2]) {
    parent[2] = child[2];
  }
  fVar1 = child[3];
  if (parent[3] <= fVar1 && fVar1 != parent[3]) {
    parent[3] = fVar1;
  }
  return;
}

Assistant:

static void AddToBBox(float child[4], float parent[4])
{
	if (child[BOXTOP] > parent[BOXTOP])
	{
		parent[BOXTOP] = child[BOXTOP];
	}
	if (child[BOXBOTTOM] < parent[BOXBOTTOM])
	{
		parent[BOXBOTTOM] = child[BOXBOTTOM];
	}
	if (child[BOXLEFT] < parent[BOXLEFT])
	{
		parent[BOXLEFT] = child[BOXLEFT];
	}
	if (child[BOXRIGHT] > parent[BOXRIGHT])
	{
		parent[BOXRIGHT] = child[BOXRIGHT];
	}
}